

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

SpatialSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_spatial_find
          (SpatialSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  char cVar6;
  unsigned_long __i0;
  long lVar7;
  runtime_error *this_00;
  Vec3fa *pVVar8;
  long lVar9;
  SpatialBinInfo<16UL,_embree::PrimRef> *__return_storage_ptr___00;
  SpatialBinInfo<16UL,_embree::PrimRef> *range;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  SpatialBinMapping<16UL> mapping;
  task_group_context context;
  SpatialBinner binner;
  task_group_context *in_stack_ffffffffffffee40;
  undefined1 local_1181 [9];
  HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
  *apHStack_1178 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1150;
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1120;
  undefined8 local_1110;
  task_group_context local_1100;
  SpatialBinInfo<16UL,_embree::PrimRef> local_1080;
  SpatialBinInfo<16UL,_embree::PrimRef> local_880;
  
  lVar7 = 0x700;
  pVVar8 = &local_1080.bounds[0][2].upper;
  do {
    (((BBox3fa *)(pVVar8 + -1))->lower).field_0.m128[0] = INFINITY;
    (((BBox3fa *)(pVVar8 + -1))->lower).field_0.m128[1] = INFINITY;
    (((BBox3fa *)(pVVar8 + -1))->lower).field_0.m128[2] = INFINITY;
    (((BBox3fa *)(pVVar8 + -1))->lower).field_0.m128[3] = INFINITY;
    (pVVar8->field_0).m128[0] = -INFINITY;
    (pVVar8->field_0).m128[1] = -INFINITY;
    (pVVar8->field_0).m128[2] = -INFINITY;
    (pVVar8->field_0).m128[3] = -INFINITY;
    *(undefined4 *)(pVVar8 + -3) = 0x7f800000;
    *(undefined4 *)((long)(pVVar8 + -3) + 4) = 0x7f800000;
    *(undefined4 *)((long)(pVVar8 + -3) + 8) = 0x7f800000;
    *(undefined4 *)((long)(pVVar8 + -3) + 0xc) = 0x7f800000;
    *(undefined4 *)(pVVar8 + -2) = 0xff800000;
    *(undefined4 *)((long)(pVVar8 + -2) + 4) = 0xff800000;
    *(undefined4 *)((long)(pVVar8 + -2) + 8) = 0xff800000;
    *(undefined4 *)((long)(pVVar8 + -2) + 0xc) = 0xff800000;
    *(undefined4 *)(pVVar8 + -5) = 0x7f800000;
    *(undefined4 *)((long)(pVVar8 + -5) + 4) = 0x7f800000;
    *(undefined4 *)((long)(pVVar8 + -5) + 8) = 0x7f800000;
    *(undefined4 *)((long)(pVVar8 + -5) + 0xc) = 0x7f800000;
    *(undefined4 *)(pVVar8 + -4) = 0xff800000;
    *(undefined4 *)((long)(pVVar8 + -4) + 4) = 0xff800000;
    *(undefined4 *)((long)(pVVar8 + -4) + 8) = 0xff800000;
    *(undefined4 *)((long)(pVVar8 + -4) + 0xc) = 0xff800000;
    *(undefined8 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar7) = 0;
    *(undefined8 *)((long)&local_1080.bounds[0][0].lower.field_0 + lVar7 + 8) = 0;
    *(undefined8 *)(local_1181 + lVar7 + 1) = 0;
    *(undefined8 *)((long)apHStack_1178 + lVar7) = 0;
    pVVar8 = pVVar8 + 6;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x800);
  local_1150 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0;
  aVar3 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0;
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx((undefined1  [16])local_1150,auVar11);
  auVar11 = vandps_avx((undefined1  [16])aVar3,auVar11);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  auVar12._0_4_ = auVar10._0_4_ * 1.5258789e-05;
  auVar12._4_4_ = auVar10._4_4_ * 1.5258789e-05;
  auVar12._8_4_ = auVar10._8_4_ * 1.5258789e-05;
  auVar12._12_4_ = auVar10._12_4_ * 1.5258789e-05;
  auVar4 = vsubps_avx((undefined1  [16])aVar3,(undefined1  [16])local_1150);
  auVar10 = vmaxps_avx(auVar12,auVar4);
  auVar13._8_4_ = 0x41800000;
  auVar13._0_8_ = 0x4180000041800000;
  auVar13._12_4_ = 0x41800000;
  auVar11 = vdivps_avx(auVar13,auVar10);
  auVar10 = vcmpps_avx(auVar4,auVar12,6);
  local_1140 = vandps_avx(auVar10,auVar11);
  local_1168 = &local_1150;
  auVar10._8_4_ = 0x3f800000;
  auVar10._0_8_ = 0x3f8000003f800000;
  auVar10._12_4_ = 0x3f800000;
  local_1130 = vdivps_avx(auVar10,local_1140);
  local_1100.my_version = proxy_support;
  local_1100.my_traits = (context_traits)0x4;
  local_1100.my_node = (intrusive_list_node)(ZEXT816(0) << 0x20);
  local_1100.my_name = CUSTOM_CTX;
  unique0x00108a80 =
       vpermilps_avx((undefined1  [16])
                     (set->super_extended_range<unsigned_long>).super_range<unsigned_long>,0x4e);
  apHStack_1178[1] = this;
  tbb::detail::r1::initialize(&local_1100);
  local_1120._0_8_ = local_1181._1_8_;
  local_1120._8_8_ = apHStack_1178[0];
  local_1110 = 0x400;
  local_1160._0_8_ = local_1181;
  __return_storage_ptr___00 = &local_880;
  range = &local_1080;
  local_1160._8_8_ = apHStack_1178 + 1;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>,embree::parallel_reduce<unsigned_long,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_spatial_find(embree::avx::PrimInfoExtRange_const&,unsigned_long)::_lambda(embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&,embree::avx::SpatialBinInfo<16ul,embree::PrimRef>const&)_1_>
            (__return_storage_ptr___00,(d1 *)&local_1120.field_1,
             (blocked_range<unsigned_long> *)range,
             (SpatialBinInfo<16UL,_embree::PrimRef> *)&local_1160.field_1,
             (anon_class_16_2_ed117de8_conflict6 *)local_1160._0_8_,
             (anon_class_1_0_00000001 *)&local_1100,in_stack_ffffffffffffee40);
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&local_1100);
  if (cVar6 == '\0') {
    tbb::detail::r1::destroy(&local_1100);
    lVar7 = 0;
    do {
      lVar9 = 0x10;
      do {
        puVar1 = (undefined8 *)((long)(__return_storage_ptr___00->bounds + -1) + 0x50 + lVar9);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)(range->bounds + -1) + 0x50 + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar2 = (undefined8 *)
                 ((long)&__return_storage_ptr___00->bounds[0][0].lower.field_0 + lVar9);
        uVar5 = puVar2[1];
        puVar1 = (undefined8 *)((long)&range->bounds[0][0].lower.field_0 + lVar9);
        *puVar1 = *puVar2;
        puVar1[1] = uVar5;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x70);
      lVar7 = lVar7 + 1;
      __return_storage_ptr___00 =
           (SpatialBinInfo<16UL,_embree::PrimRef> *)(__return_storage_ptr___00->bounds + 1);
      range = (SpatialBinInfo<16UL,_embree::PrimRef> *)(range->bounds + 1);
    } while (lVar7 != 0x10);
    memcpy(local_1080.numBegin,local_880.numBegin,0x100);
    memcpy(local_1080.numEnd,local_880.numEnd,0x100);
    SpatialBinInfo<16UL,_embree::PrimRef>::best
              (__return_storage_ptr__,&local_1080,(SpatialBinMapping<16UL> *)&local_1150.field_1,
               logBlockSize);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_spatial_find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SpatialBinner binner(empty);
          const SpatialBinMapping<SPATIAL_BINS> mapping(set);
          const SpatialBinMapping<SPATIAL_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> SpatialBinner { 
                                     SpatialBinner binner(empty); 
                                     binner.bin2(splitterFactory,prims0,r.begin(),r.end(),_mapping);
                                     return binner; },
                                   [&] (const SpatialBinner& b0, const SpatialBinner& b1) -> SpatialBinner { return SpatialBinner::reduce(b0,b1); });
          /* todo: best spatial split not exceeding the extended range does not provide any benefit ?*/
          return binner.best(mapping,logBlockSize); //,set.ext_size());
        }